

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

double ImGui::RoundScalarWithFormatT<double,double>(char *format,ImGuiDataType data_type,double v)

{
  byte bVar1;
  char cVar2;
  byte *in_RAX;
  byte *pbVar3;
  char cVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  char *__nptr;
  char *pcVar9;
  char fmt_sanitized [32];
  char v_str [64];
  byte local_78 [32];
  char local_58 [72];
  
  do {
    bVar1 = *format;
    if (bVar1 == 0) {
      iVar5 = 3;
      pbVar6 = in_RAX;
    }
    else if ((bVar1 != 0x25) || (iVar5 = 1, pbVar6 = (byte *)format, ((byte *)format)[1] == 0x25)) {
      format = (char *)((byte *)format + (ulong)(bVar1 == 0x25) + 1);
      iVar5 = 0;
      pbVar6 = in_RAX;
    }
    in_RAX = pbVar6;
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    format = (char *)pbVar6;
  }
  if ((*format == 0x25) && (((byte *)format)[1] != 0x25)) {
    pbVar3 = (byte *)ImParseFormatFindEnd(format);
    pbVar6 = local_78;
    if (format < pbVar3) {
      do {
        uVar8 = (byte)*format - 0x24;
        if ((0x3b < uVar8) || ((0x800000000000009U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
          *pbVar6 = *format;
          pbVar6 = pbVar6 + 1;
        }
        format = (char *)((byte *)format + 1);
      } while ((byte *)format != pbVar3);
    }
    *pbVar6 = 0;
    ImFormatString(local_58,0x40,(char *)local_78,v);
    pcVar9 = local_58;
    do {
      __nptr = pcVar9;
      cVar2 = *__nptr;
      pcVar9 = __nptr + 1;
    } while (cVar2 == ' ');
    if ((data_type & 0xfffffffeU) == 8) {
      v = atof(__nptr);
    }
    else {
      lVar7 = (ulong)(__nptr[cVar2 == '-'] == '+') + (ulong)(cVar2 == '-');
      cVar4 = __nptr[lVar7];
      v = 0.0;
      if ((byte)(cVar4 - 0x30U) < 10) {
        pcVar9 = __nptr + 1 + lVar7;
        do {
          v = v * 10.0 + (double)(byte)(cVar4 - 0x30);
          cVar4 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while ((byte)(cVar4 - 0x30U) < 10);
      }
      if (cVar2 == '-') {
        v = -v;
      }
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}